

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 tcb::unicode::detail::utf_traits<char,1>::encode<std::back_insert_iterator<std::__cxx11::string>>
           (code_point value,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           out)

{
  char cVar1;
  
  cVar1 = (char)out.container;
  if (0x7f < (uint)value) {
    if (0x7ff < (uint)value) {
      if (0xffff < (uint)value) {
        encode<std::back_insert_iterator<std::__cxx11::string>>();
        goto LAB_0016fe67;
      }
      std::__cxx11::string::push_back(cVar1);
    }
    std::__cxx11::string::push_back(cVar1);
  }
LAB_0016fe67:
  std::__cxx11::string::push_back(cVar1);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

static TCB_CONSTEXPR14 Iterator encode(code_point value, Iterator out)
    {
        if (value <= 0x7F) {
            *out++ = static_cast<char_type>(value);
        }
        else if (value <= 0x7FF) {
            *out++ = static_cast<char_type>((value >> 6) | 0xC0);
            *out++ = static_cast<char_type>((value & 0x3F) | 0x80);
        }
        else if (TCB_LIKELY(value <= 0xFFFF)) {
            *out++ = static_cast<char_type>((value >> 12) | 0xE0);
            *out++ = static_cast<char_type>(((value >> 6) & 0x3F) | 0x80);
            *out++ = static_cast<char_type>((value & 0x3F) | 0x80);
        }
        else {
            *out++ = static_cast<char_type>((value >> 18) | 0xF0);
            *out++ = static_cast<char_type>(((value >> 12) & 0x3F) | 0x80);
            *out++ = static_cast<char_type>(((value >> 6) & 0x3F) | 0x80);
            *out++ = static_cast<char_type>((value & 0x3F) | 0x80);
        }
        return out;
    }